

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.hpp
# Opt level: O2

GraphicsPipelineBuilder * __thiscall
vkt::geometry::GraphicsPipelineBuilder::addVertexBinding
          (GraphicsPipelineBuilder *this,VkVertexInputBindingDescription vertexBinding)

{
  value_type local_18;
  
  local_18.inputRate = vertexBinding.inputRate;
  local_18._0_8_ = vertexBinding._0_8_;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::push_back(&this->m_vertexInputBindings,&local_18);
  return this;
}

Assistant:

GraphicsPipelineBuilder&	addVertexBinding				(const vk::VkVertexInputBindingDescription vertexBinding) { m_vertexInputBindings.push_back(vertexBinding); return *this; }